

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createNoResultOp(Builder *this,Op opCode)

{
  Block *this_00;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  Instruction *local_20;
  Instruction *op;
  Builder *pBStack_10;
  Op opCode_local;
  Builder *this_local;
  
  op._4_4_ = opCode;
  pBStack_10 = this;
  this_01 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,opCode));
  Instruction::Instruction(this_01,op._4_4_);
  this_00 = this->buildPoint;
  local_20 = this_01;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,this_01)
  ;
  Block::addInstruction(this_00,local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38);
  return;
}

Assistant:

void Builder::createNoResultOp(Op opCode)
{
    Instruction* op = new Instruction(opCode);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));
}